

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

int Ivy_FastMapNodeFaninCost(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  
  if (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
    lVar4 = (long)*(int *)((long)pAig->pData + 8);
    lVar2 = *(long *)((long)pAig->pData + 0x10);
    iVar1 = *(int *)(lVar2 + 4 + pObj->Id * lVar4);
    uVar3 = -(uint)(iVar1 == 0);
    piVar5 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if ((piVar5[1] != pAig->nTravIds) && (*(int *)(lVar2 + 4 + *piVar5 * lVar4) == 0)) {
      uVar3 = (uint)(iVar1 != 0);
    }
    piVar5 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (piVar5[1] != pAig->nTravIds) {
      uVar3 = uVar3 + (*(int *)(lVar2 + 4 + *piVar5 * lVar4) == 0);
    }
    return uVar3;
  }
  __assert_fail("Ivy_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                ,0x48c,"int Ivy_FastMapNodeFaninCost(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

int Ivy_FastMapNodeFaninCost( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSuppF;
    Ivy_Obj_t * pFanin;
    int Counter = 0;
    assert( Ivy_ObjIsNode(pObj) );
    // check if the node has external refs
    pSuppF = Ivy_ObjSupp( pAig, pObj );
    if ( pSuppF->nRefs == 0 )
        Counter--;
    // increment the number of fanins without external refs
    pFanin = Ivy_ObjFanin0(pObj);
    pSuppF = Ivy_ObjSupp( pAig, pFanin );
    if ( !Ivy_ObjIsTravIdCurrent(pAig, pFanin) && pSuppF->nRefs == 0 )
        Counter++;
    // increment the number of fanins without external refs
    pFanin = Ivy_ObjFanin1(pObj);
    pSuppF = Ivy_ObjSupp( pAig, pFanin );
    if ( !Ivy_ObjIsTravIdCurrent(pAig, pFanin) && pSuppF->nRefs == 0 )
        Counter++;
    return Counter;
}